

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

bool glu::sl::isValid(ValueBlock *block)

{
  VarType *this;
  long lVar1;
  VarType *pVVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  char *format;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong local_40;
  
  uVar9 = 0;
  do {
    uVar7 = 0xffffffffffffffff;
    if (uVar9 == 3) {
LAB_01595299:
      return 2 < uVar9;
    }
    lVar8 = 0x30;
    if (uVar9 == 1) {
      lVar8 = 0x18;
    }
    if (uVar9 == 0) {
      lVar8 = 0;
    }
    this = *(VarType **)
            ((long)&(block->inputs).
                    super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar8);
    if (this == *(VarType **)
                 ((long)&(block->inputs).
                         super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl
                         .super__Vector_impl_data._M_finish + lVar8)) {
      local_40 = 0;
    }
    else {
      lVar1 = *(long *)((long)&this[2].m_data + 8);
      pVVar2 = this[2].m_data.array.elementType;
      iVar6 = glu::VarType::getScalarSize(this);
      local_40 = (ulong)(lVar1 - (long)pVVar2 >> 2) / (ulong)(long)iVar6;
    }
    lVar1 = 0;
LAB_01595214:
    lVar10 = lVar1;
    lVar3 = *(long *)((long)&(block->inputs).
                             super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar8);
    uVar7 = uVar7 + 1;
    if (uVar7 < (ulong)((*(long *)((long)&(block->inputs).
                                          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + lVar8) -
                        lVar3) / 0x50)) {
      if (*(int *)(lVar3 + lVar10) == 0) break;
      format = "ERROR: Value \'%s\' is of unsupported type!\n";
      goto LAB_0159528d;
    }
    uVar9 = uVar9 + 1;
  } while( true );
  lVar4 = *(long *)(lVar3 + 0x40 + lVar10);
  lVar5 = *(long *)(lVar3 + 0x38 + lVar10);
  iVar6 = glu::VarType::getScalarSize((VarType *)(lVar3 + lVar10));
  lVar1 = lVar10 + 0x50;
  if (lVar4 - lVar5 >> 2 != (long)iVar6 * local_40) {
    format = "ERROR: Value \'%s\' has invalid number of scalars!\n";
LAB_0159528d:
    tcu::print(format,*(undefined8 *)(lVar3 + 0x18 + lVar10));
    goto LAB_01595299;
  }
  goto LAB_01595214;
}

Assistant:

bool isValid (const ValueBlock& block)
{
	for (size_t storageNdx = 0; storageNdx < 3; ++storageNdx)
	{
		const vector<Value>&	values		= storageNdx == 0 ? block.inputs	:
											  storageNdx == 1 ? block.outputs	:
																block.uniforms;
		const size_t			refArrayLen	= values.empty() ? 0 : (values[0].elements.size() / (size_t)values[0].type.getScalarSize());

		for (size_t valNdx = 0; valNdx < values.size(); ++valNdx)
		{
			const Value&	value	= values[valNdx];

			if (!value.type.isBasicType())
			{
				print("ERROR: Value '%s' is of unsupported type!\n", value.name.c_str());
				return false;
			}

			if (value.elements.size() != refArrayLen*(size_t)value.type.getScalarSize())
			{
				print("ERROR: Value '%s' has invalid number of scalars!\n", value.name.c_str());
				return false;
			}
		}
	}

	return true;
}